

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

bool __thiscall Matrix::MultiplyRow(Matrix *this,int row,Fraction coefficient)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  Fraction local_3c;
  int local_34;
  byte local_2d;
  int column;
  bool result;
  int local_24;
  Matrix *pMStack_20;
  int row_local;
  Matrix *this_local;
  Fraction coefficient_local;
  
  local_24 = row;
  pMStack_20 = this;
  unique0x1000011a = coefficient;
  Fraction::Fraction((Fraction *)&column,1);
  bVar1 = operator==((Fraction *)((long)&this_local + 4),(Fraction *)&column);
  if (bVar1) {
    coefficient_local.numerator_._3_1_ = false;
  }
  else {
    local_2d = 0;
    for (local_34 = 0; local_34 < this->m_; local_34 = local_34 + 1) {
      pvVar2 = std::
               vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
               ::operator[](&this->elements_,(long)local_24);
      pvVar3 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](pvVar2,(long)local_34);
      Fraction::Fraction(&local_3c,0);
      bVar1 = operator!=(pvVar3,&local_3c);
      if (bVar1) {
        local_2d = 1;
        pvVar2 = std::
                 vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ::operator[](&this->elements_,(long)local_24);
        pvVar3 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](pvVar2,(long)local_34)
        ;
        Fraction::operator*=(pvVar3,(Fraction *)((long)&this_local + 4));
      }
    }
    coefficient_local.numerator_._3_1_ = (bool)(local_2d & 1);
  }
  return coefficient_local.numerator_._3_1_;
}

Assistant:

bool Matrix::MultiplyRow(int row, Fraction coefficient) {
  if (coefficient == 1) {
    return false;
  }

  bool result = false;
  for (int column = 0; column < m_; ++column) {
    if (elements_[row][column] != 0) {
      result = true;
      elements_[row][column] *= coefficient;
    }
  }

  return result;
}